

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

void jsonip::detail::stl_pushbackable_helper<std::vector<int,std::allocator<int>>>::
     write<jsonip::writer<true>>(writer<true> *w,vector<int,_std::allocator<int>_> *t)

{
  int iVar1;
  int *piVar2;
  
  writer<true>::array_start(w);
  for (piVar2 = (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start;
      piVar2 != (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    iVar1 = *piVar2;
    writer<true>::pre(w);
    std::ostream::_M_insert<double>((double)iVar1);
    w->comma = true;
  }
  writer<true>::array_end(w);
  return;
}

Assistant:

static void write(Writer& w, const T& t)
        {
            w.array_start();
            for (typename T::const_iterator it = t.begin(); it != t.end(); ++it)
            {
                slice_helper::type::write(w, *it);
            }
            w.array_end();
        }